

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

bool operator!=(SimpleString *left,SimpleString *right)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = left->buffer_;
  pcVar2 = right->buffer_;
  cVar1 = *pcVar3;
  while ((cVar1 != '\0' && (pcVar3 = pcVar3 + 1, cVar1 == *pcVar2))) {
    pcVar2 = pcVar2 + 1;
    cVar1 = *pcVar3;
  }
  return cVar1 != *pcVar2;
}

Assistant:

const char* SimpleString::getBuffer() const
{
    return buffer_;
}